

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

int zlib_freetable(zlib_table **ztab)

{
  zlib_table *ptr;
  int local_24;
  int code;
  zlib_table *tab;
  zlib_table **ztab_local;
  
  if (ztab == (zlib_table **)0x0) {
    ztab_local._4_4_ = -1;
  }
  else if (*ztab == (zlib_table *)0x0) {
    ztab_local._4_4_ = 0;
  }
  else {
    ptr = *ztab;
    for (local_24 = 0; local_24 <= ptr->mask; local_24 = local_24 + 1) {
      if (ptr->table[local_24].nexttable != (zlib_table *)0x0) {
        zlib_freetable(&ptr->table[local_24].nexttable);
      }
    }
    safefree(ptr->table);
    ptr->table = (zlib_tableentry *)0x0;
    safefree(ptr);
    *ztab = (zlib_table *)0x0;
    ztab_local._4_4_ = 0;
  }
  return ztab_local._4_4_;
}

Assistant:

static int zlib_freetable(struct zlib_table **ztab)
{
    struct zlib_table *tab;
    int code;

    if (ztab == NULL)
        return -1;

    if (*ztab == NULL)
        return 0;

    tab = *ztab;

    for (code = 0; code <= tab->mask; code++)
        if (tab->table[code].nexttable != NULL)
            zlib_freetable(&tab->table[code].nexttable);

    sfree(tab->table);
    tab->table = NULL;

    sfree(tab);
    *ztab = NULL;

    return (0);
}